

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaWrite.c
# Opt level: O2

void Pla_WritePla(Pla_Man_t *p,char *pFileName)

{
  int iVar1;
  Vec_Str_t *__ptr;
  FILE *__s;
  
  __ptr = Pla_WritePlaInt(p);
  iVar1 = __ptr->nSize;
  if (0 < (long)iVar1) {
    __s = fopen(pFileName,"wb");
    if (__s == (FILE *)0x0) {
      printf("Cannot open file \"%s\" for writing.\n",pFileName);
    }
    else {
      fwrite(__ptr->pArray,1,(long)iVar1,__s);
      fclose(__s);
    }
  }
  free(__ptr->pArray);
  free(__ptr);
  return;
}

Assistant:

void Pla_WritePla( Pla_Man_t * p, char * pFileName )
{
    Vec_Str_t * vOut = Pla_WritePlaInt( p );
    if ( Vec_StrSize(vOut) > 0 )
    {
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            fwrite( Vec_StrArray(vOut), 1, Vec_StrSize(vOut), pFile );
            fclose( pFile );
        }
    }
    Vec_StrFreeP( &vOut );
}